

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.h
# Opt level: O0

void __thiscall mocker::nasm::Call::~Call(Call *this)

{
  Call *this_local;
  
  ~Call(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit Call(std::string funcName) : funcName(std::move(funcName)) {}